

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Static_Caster<henson::PythonPuppet,_henson::BaseCoroutine>::cast
          (Static_Caster<henson::PythonPuppet,_henson::BaseCoroutine> *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  bad_boxed_dynamic_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar5;
  Boxed_Value BVar6;
  undefined1 in_stack_ffffffffffffffbf;
  Boxed_Value *local_40;
  pointer_____offset_0x10___ *local_38;
  pointer_____offset_0x10___ *obj;
  
  local_38 = &henson::PythonPuppet::typeinfo;
  obj = &henson::PythonPuppet::typeinfo;
  bVar3 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)&local_38);
  if (bVar3) {
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = (peVar2->m_type_info).m_flags;
    if (peVar2->m_is_ref == false) {
      local_40 = t_from;
      if ((uVar1 & 1) == 0) {
        cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_38);
        Boxed_Value::Object_Data::get<henson::BaseCoroutine>
                  ((Object_Data *)this,(shared_ptr<henson::BaseCoroutine> *)&local_38,false);
      }
      else {
        cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_38);
        Boxed_Value::Object_Data::get<henson::BaseCoroutine_const>
                  ((Object_Data *)this,(shared_ptr<const_henson::BaseCoroutine> *)&local_38,false);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
      _Var4._M_pi = extraout_RDX;
    }
    else if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<henson::PythonPuppet_&>::cast(t_from,(Type_Conversions_State *)0x0);
      sVar5 = Boxed_Value::Object_Data::get<henson::BaseCoroutine>
                        ((reference_wrapper<henson::BaseCoroutine>)obj,
                         (bool)in_stack_ffffffffffffffbf);
      _Var4 = sVar5.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<const_henson::PythonPuppet_&>::cast(t_from,(Type_Conversions_State *)0x0);
      sVar5 = Boxed_Value::Object_Data::get<henson::BaseCoroutine_const>
                        ((reference_wrapper<const_henson::BaseCoroutine>)obj,
                         (bool)in_stack_ffffffffffffffbf);
      _Var4 = sVar5.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar6.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x48);
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)&local_38,"Unknown dynamic_cast_conversion",(allocator *)&local_40);
  chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
            (this_00,&peVar2->m_type_info,(type_info *)&henson::BaseCoroutine::typeinfo,
             (string *)&local_38);
  __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
              chaiscript::exception::bad_boxed_cast::~bad_boxed_cast);
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = static_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = static_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }